

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactionProduct.test.cpp
# Opt level: O2

void verifyChunkWithLAW1(ReactionProduct *chunk)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  int iVar2;
  long *plVar3;
  bool bVar4;
  long lVar5;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *pIVar6;
  ListRecord *pLVar7;
  range_reference_t<D<true>_>_conflict pdVar8;
  iterator_t<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>_>
  iVar9;
  double dVar10;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  LegendreCoefficients subsection1;
  LegendreCoefficients subsection2;
  AssertionHandler catchAssertionHandler_68;
  undefined1 local_150 [8];
  undefined8 local_148;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  undefined1 local_118 [8];
  bool local_110;
  bool bStack_10f;
  undefined6 uStack_10e;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_108;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_100;
  ContinuumEnergyAngle law;
  undefined1 local_78 [9];
  bool local_6f;
  vector<double,_std::allocator<double>_> *local_68;
  WithinRelMatcher *local_60;
  double local_58;
  double local_50 [2];
  vector<double,_std::allocator<double>_> *local_40;
  long local_38;
  
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x37f;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x13;
  capturedExpression.m_start = "1001 == chunk.ZAP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName,(SourceLineInfo *)&subsection1,capturedExpression,
             ContinueOnFailure);
  dVar10 = round((chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Head_base<0UL,_double,_false>._M_head_impl);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (int)dVar10 == 0x3e9;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 0x3e9;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = (int)dVar10;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x380;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x23;
  capturedExpression_00.m_start = "0.9986234, WithinRel( chunk.AWP() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_00,(SourceLineInfo *)&subsection1,
             capturedExpression_00,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3feff4b90f80a684;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                     fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x381;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "0 == chunk.LIP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_01,(SourceLineInfo *)&subsection1,
             capturedExpression_01,ContinueOnFailure);
  iVar2 = (int)((_Head_base<2UL,_long,_false> *)
               ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                       metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       iVar2 == 0;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl &
       0xffffffff;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = iVar2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x382;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x10;
  capturedExpression_02.m_start = "1 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_02,(SourceLineInfo *)&subsection1,
             capturedExpression_02,ContinueOnFailure);
  iVar2 = (int)((_Head_base<3UL,_long,_false> *)
               ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                       metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       iVar2 == 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = iVar2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 900;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x22;
  capturedExpression_03.m_start = "1001 == chunk.multiplicity().ZAP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_03,(SourceLineInfo *)&subsection1,
             capturedExpression_03,ContinueOnFailure);
  dVar10 = round((chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Head_base<0UL,_double,_false>._M_head_impl);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (int)dVar10 == 0x3e9;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 0x3e9;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = (int)dVar10;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x385;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x32;
  capturedExpression_04.m_start = "0.9986234, WithinRel( chunk.multiplicity().AWP() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_04,(SourceLineInfo *)&subsection1,
             capturedExpression_04,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3feff4b90f80a684;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                     fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x386;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x1f;
  capturedExpression_05.m_start = "0 == chunk.multiplicity().LIP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_05,(SourceLineInfo *)&subsection1,
             capturedExpression_05,ContinueOnFailure);
  iVar2 = (int)((_Head_base<2UL,_long,_false> *)
               ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                       metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       iVar2 == 0;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl &
       0xffffffff;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = iVar2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x387;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1f;
  capturedExpression_06.m_start = "1 == chunk.multiplicity().LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_06,(SourceLineInfo *)&subsection1,
             capturedExpression_06,ContinueOnFailure);
  iVar2 = (int)((_Head_base<3UL,_long,_false> *)
               ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                       metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       iVar2 == 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = iVar2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x389;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x1e;
  capturedExpression_07.m_start = "4 == chunk.multiplicity().NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_07,(SourceLineInfo *)&subsection1,
             capturedExpression_07,ContinueOnFailure);
  lVar5 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 0x20;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38a;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x28;
  capturedExpression_08.m_start = "4 == chunk.multiplicity().numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_08,(SourceLineInfo *)&subsection1,
             capturedExpression_08,ContinueOnFailure);
  lVar5 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 0x20;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38b;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x1e;
  capturedExpression_09.m_start = "1 == chunk.multiplicity().NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_09,(SourceLineInfo *)&subsection1,
             capturedExpression_09,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38c;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x36;
  capturedExpression_10.m_start = "1 == chunk.multiplicity().numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_10,(SourceLineInfo *)&subsection1,
             capturedExpression_10,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38d;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x26;
  capturedExpression_11.m_start = "1 == chunk.multiplicity().INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_11,(SourceLineInfo *)&subsection1,
             capturedExpression_11,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38e;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x26;
  capturedExpression_12.m_start = "1 == chunk.multiplicity().NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_12,(SourceLineInfo *)&subsection1,
             capturedExpression_12,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x38f;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x22;
  capturedExpression_13.m_start = "2 == chunk.multiplicity().INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_13,(SourceLineInfo *)&subsection1,
             capturedExpression_13,ContinueOnFailure);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x390;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x22;
  capturedExpression_14.m_start = "4 == chunk.multiplicity().NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_14,(SourceLineInfo *)&subsection1,
             capturedExpression_14,ContinueOnFailure);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                          boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 1.97626258336499e-323;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x391;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x2f;
  capturedExpression_15.m_start = "1 == chunk.multiplicity().interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_15,(SourceLineInfo *)&subsection1,
             capturedExpression_15,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x392;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x2d;
  capturedExpression_16.m_start = "1 == chunk.multiplicity().boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_16,(SourceLineInfo *)&subsection1,
             capturedExpression_16,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                         boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x393;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x2b;
  capturedExpression_17.m_start = "2 == chunk.multiplicity().interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_17,(SourceLineInfo *)&subsection1,
             capturedExpression_17,ContinueOnFailure);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x394;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "4 == chunk.multiplicity().boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_18,(SourceLineInfo *)&subsection1,
             capturedExpression_18,ContinueOnFailure);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                          boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 1.97626258336499e-323;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x395;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x2b;
  capturedExpression_19.m_start = "4 == chunk.multiplicity().energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_19,(SourceLineInfo *)&subsection1,
             capturedExpression_19,ContinueOnFailure);
  lVar5 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 0x20;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x396;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x31;
  capturedExpression_20.m_start = "4 == chunk.multiplicity().multiplicities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_20,(SourceLineInfo *)&subsection1,
             capturedExpression_20,ContinueOnFailure);
  lVar5 = (long)(chunk->multiplicity_).super_TabulationRecord.yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->multiplicity_).super_TabulationRecord.yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 0x20;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 4;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection1)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x397;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x35;
  capturedExpression_21.m_start = "1e-5, WithinRel( chunk.multiplicity().energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_21,(SourceLineInfo *)&subsection1,
             capturedExpression_21,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             *(chunk->multiplicity_).super_TabulationRecord.xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x398;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x37;
  capturedExpression_22.m_start = "1.1e+7, WithinRel( chunk.multiplicity().energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_22,(SourceLineInfo *)&subsection1,
             capturedExpression_22,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x4164fb1800000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x399;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x39;
  capturedExpression_23.m_start = "1.147e+7, WithinRel( chunk.multiplicity().energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_23,(SourceLineInfo *)&subsection1,
             capturedExpression_23,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x4165e09600000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x39a;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x35;
  capturedExpression_24.m_start = "2e+7, WithinRel( chunk.multiplicity().energies()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_24,(SourceLineInfo *)&subsection1,
             capturedExpression_24,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x39b;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x39;
  capturedExpression_25.m_start = "0., WithinRel( chunk.multiplicity().multiplicities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_25,(SourceLineInfo *)&subsection1,
             capturedExpression_25,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             *(chunk->multiplicity_).super_TabulationRecord.yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x39c;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x42;
  capturedExpression_26.m_start =
       "8.45368e-11, WithinRel( chunk.multiplicity().multiplicities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_26,(SourceLineInfo *)&subsection1,
             capturedExpression_26,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3dd73cbf9a9a437f;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x39d;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x42;
  capturedExpression_27.m_start =
       "6.622950e-8, WithinRel( chunk.multiplicity().multiplicities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_27,(SourceLineInfo *)&subsection1,
             capturedExpression_27,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3e71c741af855bf3;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection1.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x39e;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x42;
  capturedExpression_28.m_start =
       "2.149790e-1, WithinRel( chunk.multiplicity().multiplicities()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&law,macroName_28,(SourceLineInfo *)&subsection1,
             capturedExpression_28,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start = (char *)0x3fcb846e8f29d40f;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&subsection1,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&subsection1,(double *)&catchAssertionHandler_68);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ = bVar4;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e328;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&catchAssertionHandler_68;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&subsection1;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&law,(ITransientExpression *)&subsection2)
  ;
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&subsection1);
  Catch::AssertionHandler::complete((AssertionHandler *)&law);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&law);
  pIVar6 = &std::
            get<2ul,njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                      (&chunk->law_)->data_;
  njoy::ENDFtk::
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  ::InterpolationSequenceRecord(&law.data_,pIVar6);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a2;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0xe;
  capturedExpression_29.m_start = "1 == law.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_29,(SourceLineInfo *)&subsection2,
             capturedExpression_29,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_2_ = 0x101;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = 1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a3;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0xe;
  capturedExpression_30.m_start = "2 == law.LEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_30,(SourceLineInfo *)&subsection2,
             capturedExpression_30,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (int)law.data_.interpolation_.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl == 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e2e8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ =
       (int)law.data_.interpolation_.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a4;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0xd;
  capturedExpression_31.m_start = "2 == law.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_31,(SourceLineInfo *)&subsection2,
             capturedExpression_31,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1];
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a5;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x21;
  capturedExpression_32.m_start = "2 == law.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_32,(SourceLineInfo *)&subsection2,
             capturedExpression_32,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1];
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a6;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0xd;
  capturedExpression_33.m_start = "1 == law.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_33,(SourceLineInfo *)&subsection2,
             capturedExpression_33,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a7;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x25;
  capturedExpression_34.m_start = "1 == law.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_34,(SourceLineInfo *)&subsection2,
             capturedExpression_34,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a8;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0x15;
  capturedExpression_35.m_start = "1 == law.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_35,(SourceLineInfo *)&subsection2,
             capturedExpression_35,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3a9;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x15;
  capturedExpression_36.m_start = "1 == law.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_36,(SourceLineInfo *)&subsection2,
             capturedExpression_36,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3aa;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x11;
  capturedExpression_37.m_start = "1 == law.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_37,(SourceLineInfo *)&subsection2,
             capturedExpression_37,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*law.data_.interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 4.94065645841247e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3ab;
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  capturedExpression_38.m_size = 0x11;
  capturedExpression_38.m_start = "2 == law.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_38,(SourceLineInfo *)&subsection2,
             capturedExpression_38,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3ac;
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  capturedExpression_39.m_size = 0x1e;
  capturedExpression_39.m_start = "1 == law.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_39,(SourceLineInfo *)&subsection2,
             capturedExpression_39,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3ad;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x1c;
  capturedExpression_40.m_start = "1 == law.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_40,(SourceLineInfo *)&subsection2,
             capturedExpression_40,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)((long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e3a8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3ae;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0x1a;
  capturedExpression_41.m_start = "1 == law.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_41,(SourceLineInfo *)&subsection2,
             capturedExpression_41,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*law.data_.interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 4.94065645841247e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_62;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x3af;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x18;
  capturedExpression_42.m_start = "2 == law.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_42,(SourceLineInfo *)&subsection2,
             capturedExpression_42,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*law.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_0021e368;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_51d86;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  pLVar7 = (ListRecord *)
           std::
           get<0ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                     (law.data_.sequence_.
                      super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  njoy::ENDFtk::ListRecord::ListRecord((ListRecord *)&subsection1,pLVar7);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3b5;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x2f;
  capturedExpression_43.m_start = "1e-5, WithinRel( subsection1.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_43,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_43,ContinueOnFailure);
  local_118 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_68,
             subsection1.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_118);
  local_148._1_1_ = bVar4;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_140._M_current = (double *)local_118;
  local_138[0]._0_8_ = &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3b6;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x15;
  capturedExpression_44.m_start = "0 == subsection1.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_44,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_44,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl == 0,1);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e368;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       catchAssertionHandler_68.m_assertionInfo.macroName.m_size & 0xffffffff;
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3b7;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x15;
  capturedExpression_45.m_start = "1 == subsection1.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_45,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_45,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                _M_head_impl == 1,1);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e368;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3b8;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x16;
  capturedExpression_46.m_start = "12 == subsection1.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_46,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_46,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)((long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x60,1);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e368;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(0xc,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3b9;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x16;
  capturedExpression_47.m_start = "4 == subsection1.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_47,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_47,ContinueOnFailure);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl == 4,1)
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e368;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3ba;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x22;
  capturedExpression_48.m_start = "4 == subsection1.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_48,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_48,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_150,&subsection1.super_Base);
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)((ulong)((long)local_140._M_current +
                       ((long)*(pointer *)(local_148 + 8) - *(long *)local_148 >> 3) + -1) /
               (ulong)local_140._M_current);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start == (char *)0x4,1
               );
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e3a8;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3bb;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x2a;
  capturedExpression_49.m_start = "1., WithinRel( subsection1.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_49,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_49,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x3ff0000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_118,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_118,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_148._1_1_ = bVar4;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_140._M_current = (double *)local_78;
  local_138[0]._0_8_ = &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3bc;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x2a;
  capturedExpression_50.m_start = "4., WithinRel( subsection1.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_50,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_50,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4010000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_118,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_118,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  local_148._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_140._M_current = (double *)local_78;
  local_138[0]._0_8_ = &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3bd;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x2a;
  capturedExpression_51.m_start = "7., WithinRel( subsection1.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_51,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_51,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x401c000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_118,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_118,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  local_148._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_140._M_current = (double *)local_78;
  local_138[0]._0_8_ = &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3be;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2b;
  capturedExpression_52.m_start = "10., WithinRel( subsection1.energies()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_52,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_52,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4024000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_118,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_118,3);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  local_148._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_140._M_current = (double *)local_78;
  local_138[0]._0_8_ = &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3bf;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x26;
  capturedExpression_53.m_start = "4 == subsection1.coefficients().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_53,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_53,ContinueOnFailure);
  pvVar1 = &subsection1.super_Base.super_ListRecord.data;
  local_138[0]._0_8_ =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_140._M_current = (double *)pvVar1;
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)ranges::
               chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
               size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start == (char *)0x4,1
               );
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e3a8;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c0;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x31;
  capturedExpression_54.m_start = "2., WithinRel( subsection1.coefficients()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_54,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_54,ContinueOnFailure);
  local_50[0] = 2.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,0);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*iVar9._M_current);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c1;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x31;
  capturedExpression_55.m_start = "3., WithinRel( subsection1.coefficients()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_55,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_55,ContinueOnFailure);
  local_50[0] = 3.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,0);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,iVar9._M_current[1]);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c2;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x31;
  capturedExpression_56.m_start = "5., WithinRel( subsection1.coefficients()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_56,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_56,ContinueOnFailure);
  local_50[0] = 5.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,1);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*iVar9._M_current);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c3;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x31;
  capturedExpression_57.m_start = "6., WithinRel( subsection1.coefficients()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_57,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_57,ContinueOnFailure);
  local_50[0] = 6.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,1);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,iVar9._M_current[1]);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c4;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x31;
  capturedExpression_58.m_start = "8., WithinRel( subsection1.coefficients()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_58,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_58,ContinueOnFailure);
  local_50[0] = 8.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,2);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*iVar9._M_current);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c5;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x31;
  capturedExpression_59.m_start = "9., WithinRel( subsection1.coefficients()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_59,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_59,ContinueOnFailure);
  local_50[0] = 9.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,2);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,iVar9._M_current[1]);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c6;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x32;
  capturedExpression_60.m_start = "11., WithinRel( subsection1.coefficients()[3][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_60,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_60,ContinueOnFailure);
  local_50[0] = 11.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = &subsection1.super_Base.super_ListRecord.data;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,3);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*iVar9._M_current);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c7;
  macroName_61.m_size = 10;
  macroName_61.m_start = "CHECK_THAT";
  capturedExpression_61.m_size = 0x32;
  capturedExpression_61.m_start = "12., WithinRel( subsection1.coefficients()[3][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_61,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_61,ContinueOnFailure);
  local_50[0] = 12.0;
  local_60 = (WithinRelMatcher *)
             (subsection1.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_68 = &subsection1.super_Base.super_ListRecord.data;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_150,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_78,3);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_150);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,iVar9._M_current[1]);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c8;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x34;
  capturedExpression_62.m_start = "4 == subsection1.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_62,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_62,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_150,&subsection1.super_Base);
  catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start =
       (char *)(((((long)local_148 - (long)local_140._M_current >> 3) +
                 local_138[0]._M_allocated_capacity) - 1U) / (ulong)local_138[0]._0_8_);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_68.m_assertionInfo.capturedExpression.m_start == (char *)0x4,1
               );
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_0021e3a8;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_68.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_68.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_68.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_68);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3c9;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x3c;
  capturedExpression_63.m_start = "2., WithinRel( subsection1.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_63,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_63,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4000000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_150,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_150,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = (double *)local_78;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3ca;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x3c;
  capturedExpression_64.m_start = "5., WithinRel( subsection1.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_64,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_64,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4014000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_150,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_150,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = (double *)local_78;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3cb;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x3c;
  capturedExpression_65.m_start = "8., WithinRel( subsection1.totalEmissionProbabilities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_65,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_65,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4020000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_150,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_150,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = (double *)local_78;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_68.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ReactionProduct/test/ReactionProduct.test.cpp"
  ;
  catchAssertionHandler_68.m_assertionInfo.macroName.m_size = 0x3cc;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x3d;
  capturedExpression_66.m_start = "11., WithinRel( subsection1.totalEmissionProbabilities()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_66,
             (SourceLineInfo *)&catchAssertionHandler_68,capturedExpression_66,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x4026000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_150,&subsection1.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_150,3);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_68,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)&catchAssertionHandler_68,(double *)local_78);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = (double *)local_78;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       &catchAssertionHandler_68;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_68);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  pLVar7 = (ListRecord *)
           std::
           get<0ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                     (law.data_.sequence_.
                      super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
  njoy::ENDFtk::ListRecord::ListRecord((ListRecord *)&subsection2,pLVar7);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3cf;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x2f;
  capturedExpression_67.m_start = "2e+7, WithinRel( subsection2.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_67,(SourceLineInfo *)local_150,
             capturedExpression_67,ContinueOnFailure);
  local_78._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_150,
             subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match
                         ((WithinRelMatcher *)local_150,(double *)local_78);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = (double *)local_78;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d0;
  macroName_68.m_size = 5;
  macroName_68.m_start = "CHECK";
  capturedExpression_68.m_size = 0x17;
  capturedExpression_68.m_start = "1 == subsection2.LANG()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_68,(SourceLineInfo *)local_150,
             capturedExpression_68,ContinueOnFailure);
  local_148._0_2_ = 0x101;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e2e8;
  local_148._4_4_ = 1;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  local_138[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d1;
  macroName_69.m_size = 5;
  macroName_69.m_start = "CHECK";
  capturedExpression_69.m_size = 0x15;
  capturedExpression_69.m_start = "0 == subsection2.ND()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_69,(SourceLineInfo *)local_150,
             capturedExpression_69,ContinueOnFailure);
  local_148._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl == 0;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e368;
  local_148 = local_148 & 0xffffffff;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  local_138[0]._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d2;
  macroName_70.m_size = 5;
  macroName_70.m_start = "CHECK";
  capturedExpression_70.m_size = 0x15;
  capturedExpression_70.m_start = "1 == subsection2.NA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_70,(SourceLineInfo *)local_150,
             capturedExpression_70,ContinueOnFailure);
  local_148._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl == 1;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e368;
  local_148._4_4_ = 1;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  local_138[0]._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d3;
  macroName_71.m_size = 5;
  macroName_71.m_start = "CHECK";
  capturedExpression_71.m_size = 0x15;
  capturedExpression_71.m_start = "6 == subsection2.NW()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_71,(SourceLineInfo *)local_150,
             capturedExpression_71,ContinueOnFailure);
  local_138[0]._8_8_ =
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_148._1_1_ =
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x30;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e368;
  local_148._4_4_ = 6;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d4;
  macroName_72.m_size = 5;
  macroName_72.m_start = "CHECK";
  capturedExpression_72.m_size = 0x16;
  capturedExpression_72.m_start = "2 == subsection2.NEP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_72,(SourceLineInfo *)local_150,
             capturedExpression_72,ContinueOnFailure);
  local_148._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl == 2;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e368;
  local_148._4_4_ = 2;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  local_138[0]._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d5;
  macroName_73.m_size = 5;
  macroName_73.m_start = "CHECK";
  capturedExpression_73.m_size = 0x22;
  capturedExpression_73.m_start = "2 == subsection2.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_73,(SourceLineInfo *)local_150,
             capturedExpression_73,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_118,&subsection2.super_Base);
  plVar3 = (long *)CONCAT62(uStack_10e,CONCAT11(bStack_10f,local_110));
  local_138[0]._8_8_ =
       (((long)local_108._M_current + (plVar3[1] - *plVar3 >> 3)) - 1U) /
       (ulong)local_108._M_current;
  local_148._1_1_ = local_138[0]._8_8_ == 2;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e3a8;
  local_148._4_4_ = 2;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d6;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2a;
  capturedExpression_74.m_start = "1., WithinRel( subsection2.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_74,(SourceLineInfo *)local_150,
             capturedExpression_74,ContinueOnFailure);
  local_50[0] = 1.0;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_78,&subsection2.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d7;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2a;
  capturedExpression_75.m_start = "4., WithinRel( subsection2.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_75,(SourceLineInfo *)local_150,
             capturedExpression_75,ContinueOnFailure);
  local_50[0] = 4.0;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_78,&subsection2.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*pdVar8);
  bStack_10f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,local_50);
  local_110 = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e328;
  local_108._M_current = local_50;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d8;
  macroName_76.m_size = 5;
  macroName_76.m_start = "CHECK";
  capturedExpression_76.m_size = 0x26;
  capturedExpression_76.m_start = "2 == subsection2.coefficients().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_76,(SourceLineInfo *)local_150,
             capturedExpression_76,ContinueOnFailure);
  pvVar1 = &subsection2.super_Base.super_ListRecord.data;
  local_100._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (subsection2.super_Base.super_ListRecord.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl + 2);
  local_108._M_current = (double *)pvVar1;
  local_138[0]._8_8_ =
       ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
       size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_148._1_1_ = local_138[0]._8_8_ == 2;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e3a8;
  local_148._4_4_ = 2;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3d9;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x31;
  capturedExpression_77.m_start = "2., WithinRel( subsection2.coefficients()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_77,(SourceLineInfo *)local_150,
             capturedExpression_77,ContinueOnFailure);
  local_58 = 2.0;
  local_38 = subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_40 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_118,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_50,0);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_118);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*iVar9._M_current);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,&local_58);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)&local_58;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3da;
  macroName_78.m_size = 10;
  macroName_78.m_start = "CHECK_THAT";
  capturedExpression_78.m_size = 0x31;
  capturedExpression_78.m_start = "3., WithinRel( subsection2.coefficients()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_78,(SourceLineInfo *)local_150,
             capturedExpression_78,ContinueOnFailure);
  local_58 = 3.0;
  local_38 = subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_40 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_118,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_50,0);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_118);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,iVar9._M_current[1]);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,&local_58);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)&local_58;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3db;
  macroName_79.m_size = 10;
  macroName_79.m_start = "CHECK_THAT";
  capturedExpression_79.m_size = 0x31;
  capturedExpression_79.m_start = "5., WithinRel( subsection2.coefficients()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_79,(SourceLineInfo *)local_150,
             capturedExpression_79,ContinueOnFailure);
  local_58 = 5.0;
  local_38 = subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_40 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_118,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_50,1);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_118);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*iVar9._M_current);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,&local_58);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)&local_58;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3dc;
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  capturedExpression_80.m_size = 0x31;
  capturedExpression_80.m_start = "6., WithinRel( subsection2.coefficients()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_80,(SourceLineInfo *)local_150,
             capturedExpression_80,ContinueOnFailure);
  local_58 = 6.0;
  local_38 = subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_40 = pvVar1;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict2 *)local_118,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::views::tail_fn>_>_>,_(ranges::cardinality)_1>
              *)local_50,1);
  iVar9 = ranges::
          tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
          ::begin((tail_view<ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>
                   *)local_118);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,iVar9._M_current[1]);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,&local_58);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)&local_58;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3dd;
  macroName_81.m_size = 5;
  macroName_81.m_start = "CHECK";
  capturedExpression_81.m_size = 0x34;
  capturedExpression_81.m_start = "2 == subsection2.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_81,(SourceLineInfo *)local_150,
             capturedExpression_81,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_118,&subsection2.super_Base);
  local_138[0]._8_8_ =
       (((CONCAT62(uStack_10e,CONCAT11(bStack_10f,local_110)) - (long)local_108._M_current >> 3) +
        (long)local_100._M_head_impl._M_current) - 1U) / (ulong)local_100._M_head_impl._M_current;
  local_148._1_1_ = local_138[0]._8_8_ == 2;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e3a8;
  local_148._4_4_ = 2;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3de;
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  capturedExpression_82.m_size = 0x3c;
  capturedExpression_82.m_start = "2., WithinRel( subsection2.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_82,(SourceLineInfo *)local_150,
             capturedExpression_82,ContinueOnFailure);
  local_50[0] = 2.0;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_118,&subsection2.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_118,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*pdVar8);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,local_50);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)local_50;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3df;
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  capturedExpression_83.m_size = 0x3c;
  capturedExpression_83.m_start = "5., WithinRel( subsection2.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_83,(SourceLineInfo *)local_150,
             capturedExpression_83,ContinueOnFailure);
  local_50[0] = 5.0;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_118,&subsection2.super_Base);
  pdVar8 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_118,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_150,*pdVar8);
  local_6f = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_150,local_50);
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_0021e328;
  local_68 = (vector<double,_std::allocator<double>_> *)local_50;
  local_60 = (WithinRelMatcher *)local_150;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  local_150 = (undefined1  [8])0x1b959c;
  local_148 = (pointer)0x3e1;
  macroName_84.m_size = 5;
  macroName_84.m_start = "CHECK";
  capturedExpression_84.m_size = 0x10;
  capturedExpression_84.m_start = "11 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_68,macroName_84,(SourceLineInfo *)local_150,
             capturedExpression_84,ContinueOnFailure);
  local_138[0]._8_8_ = njoy::ENDFtk::section::Type<6>::ReactionProduct::NC(chunk);
  local_148._1_1_ = local_138[0]._8_8_ == 0xb;
  local_148._0_1_ = true;
  local_150 = (undefined1  [8])&PTR_streamReconstructedExpression_0021e368;
  local_148._4_4_ = 0xb;
  local_140._M_current = (double *)0x1be61a;
  local_138[0]._M_allocated_capacity = (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_68,(ITransientExpression *)local_150);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_68);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pvVar1->super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&subsection1.super_Base.super_ListRecord.data.
              super__Vector_base<double,_std::allocator<double>_>);
  njoy::ENDFtk::
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  ::~InterpolationSequenceRecord(&law.data_);
  return;
}

Assistant:

void verifyChunkWithLAW1( const ReactionProduct& chunk ) {

  CHECK( 1001 == chunk.ZAP() );
  CHECK_THAT( 0.9986234, WithinRel( chunk.AWP() ) );
  CHECK( 0 == chunk.LIP() );
  CHECK( 1 == chunk.LAW() );

  CHECK( 1001 == chunk.multiplicity().ZAP() );
  CHECK_THAT( 0.9986234, WithinRel( chunk.multiplicity().AWP() ) );
  CHECK( 0 == chunk.multiplicity().LIP() );
  CHECK( 1 == chunk.multiplicity().LAW() );

  CHECK( 4 == chunk.multiplicity().NP() );
  CHECK( 4 == chunk.multiplicity().numberPoints() );
  CHECK( 1 == chunk.multiplicity().NR() );
  CHECK( 1 == chunk.multiplicity().numberInterpolationRegions() );
  CHECK( 1 == chunk.multiplicity().INT().size() );
  CHECK( 1 == chunk.multiplicity().NBT().size() );
  CHECK( 2 == chunk.multiplicity().INT()[0] );
  CHECK( 4 == chunk.multiplicity().NBT()[0] );
  CHECK( 1 == chunk.multiplicity().interpolants().size() );
  CHECK( 1 == chunk.multiplicity().boundaries().size() );
  CHECK( 2 == chunk.multiplicity().interpolants()[0] );
  CHECK( 4 == chunk.multiplicity().boundaries()[0] );
  CHECK( 4 == chunk.multiplicity().energies().size() );
  CHECK( 4 == chunk.multiplicity().multiplicities().size() );
  CHECK_THAT( 1e-5, WithinRel( chunk.multiplicity().energies()[0] ) );
  CHECK_THAT( 1.1e+7, WithinRel( chunk.multiplicity().energies()[1] ) );
  CHECK_THAT( 1.147e+7, WithinRel( chunk.multiplicity().energies()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( chunk.multiplicity().energies()[3] ) );
  CHECK_THAT( 0., WithinRel( chunk.multiplicity().multiplicities()[0] ) );
  CHECK_THAT( 8.45368e-11, WithinRel( chunk.multiplicity().multiplicities()[1] ) );
  CHECK_THAT( 6.622950e-8, WithinRel( chunk.multiplicity().multiplicities()[2] ) );
  CHECK_THAT( 2.149790e-1, WithinRel( chunk.multiplicity().multiplicities()[3] ) );

  auto law = std::get< ContinuumEnergyAngle >( chunk.distribution() );

  CHECK( 1 == law.LAW() );
  CHECK( 2 == law.LEP() );
  CHECK( 2 == law.NE() );
  CHECK( 2 == law.numberIncidentEnergies() );
  CHECK( 1 == law.NR() );
  CHECK( 1 == law.numberInterpolationRegions() );
  CHECK( 1 == law.INT().size() );
  CHECK( 1 == law.NBT().size() );
  CHECK( 1 == law.INT()[0] );
  CHECK( 2 == law.NBT()[0] );
  CHECK( 1 == law.interpolants().size() );
  CHECK( 1 == law.boundaries().size() );
  CHECK( 1 == law.interpolants()[0] );
  CHECK( 2 == law.boundaries()[0] );

  auto energies = law.distributions();

  auto subsection1 =
      std::get< LegendreCoefficients >( energies[0] );
  CHECK_THAT( 1e-5, WithinRel( subsection1.incidentEnergy() ) );
  CHECK( 0 == subsection1.ND() );
  CHECK( 1 == subsection1.NA() );
  CHECK( 12 == subsection1.NW() );
  CHECK( 4 == subsection1.NEP() );
  CHECK( 4 == subsection1.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection1.energies()[0] ) );
  CHECK_THAT( 4., WithinRel( subsection1.energies()[1] ) );
  CHECK_THAT( 7., WithinRel( subsection1.energies()[2] ) );
  CHECK_THAT( 10., WithinRel( subsection1.energies()[3] ) );
  CHECK( 4 == subsection1.coefficients().size() );
  CHECK_THAT( 2., WithinRel( subsection1.coefficients()[0][0] ) );
  CHECK_THAT( 3., WithinRel( subsection1.coefficients()[0][1] ) );
  CHECK_THAT( 5., WithinRel( subsection1.coefficients()[1][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.coefficients()[1][1] ) );
  CHECK_THAT( 8., WithinRel( subsection1.coefficients()[2][0] ) );
  CHECK_THAT( 9., WithinRel( subsection1.coefficients()[2][1] ) );
  CHECK_THAT( 11., WithinRel( subsection1.coefficients()[3][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.coefficients()[3][1] ) );
  CHECK( 4 == subsection1.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection1.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.totalEmissionProbabilities()[1] ) );
  CHECK_THAT( 8., WithinRel( subsection1.totalEmissionProbabilities()[2] ) );
  CHECK_THAT( 11., WithinRel( subsection1.totalEmissionProbabilities()[3] ) );

  auto subsection2 = std::get< LegendreCoefficients >( energies[1] );
  CHECK_THAT( 2e+7, WithinRel( subsection2.incidentEnergy() ) );
  CHECK( 1 == subsection2.LANG() );
  CHECK( 0 == subsection2.ND() );
  CHECK( 1 == subsection2.NA() );
  CHECK( 6 == subsection2.NW() );
  CHECK( 2 == subsection2.NEP() );
  CHECK( 2 == subsection2.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection2.energies()[0] ) );
  CHECK_THAT( 4., WithinRel( subsection2.energies()[1] ) );
  CHECK( 2 == subsection2.coefficients().size() );
  CHECK_THAT( 2., WithinRel( subsection2.coefficients()[0][0] ) );
  CHECK_THAT( 3., WithinRel( subsection2.coefficients()[0][1] ) );
  CHECK_THAT( 5., WithinRel( subsection2.coefficients()[1][0] ) );
  CHECK_THAT( 6., WithinRel( subsection2.coefficients()[1][1] ) );
  CHECK( 2 == subsection2.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection2.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 5., WithinRel( subsection2.totalEmissionProbabilities()[1] ) );

  CHECK( 11 == chunk.NC() );
}